

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr,int rHasNullFlag,int isRowid)

{
  u8 uVar1;
  byte bVar2;
  Select *pSVar3;
  SrcList *p;
  ExprList *pEVar4;
  KeyInfo *pKVar5;
  Parse *pPVar6;
  char cVar7;
  undefined1 uVar8;
  uint N;
  int iVar9;
  int iVar10;
  Vdbe *p_00;
  CollSeq *pCVar11;
  Expr *pEVar12;
  uint p2;
  char *pcVar13;
  int p1;
  int op;
  int iVar14;
  ExprList_item *pEVar15;
  SrcList **ppSVar16;
  ulong uVar17;
  ulong uVar18;
  int local_88;
  char local_81;
  Expr *local_80;
  int local_74;
  KeyInfo *local_70;
  Parse *local_68;
  Expr *local_60;
  int local_58;
  int local_54;
  int iValToIns;
  int local_4c;
  undefined8 local_48;
  char *pcStack_40;
  
  local_68 = pParse;
  p_00 = sqlite3GetVdbe(pParse);
  if (p_00 == (Vdbe *)0x0) {
LAB_0014f664:
    iVar9 = 0;
  }
  else {
    if ((pExpr->flags & 0x20) == 0) {
      local_88 = sqlite3VdbeAddOp0(p_00,0x11);
    }
    else {
      local_88 = -1;
    }
    if (pExpr->op == '1') {
      local_60 = pExpr->pLeft;
      N = sqlite3ExprVectorSize(local_60);
      pPVar6 = local_68;
      iVar9 = local_68->nTab;
      local_68->nTab = iVar9 + 1;
      pExpr->iTable = iVar9;
      local_70 = (KeyInfo *)0x0;
      p2 = 0;
      if (isRowid == 0) {
        p2 = N;
      }
      local_58 = sqlite3VdbeAddOp2(p_00,0x71,iVar9,p2);
      if (isRowid == 0) {
        local_70 = sqlite3KeyInfoAlloc(pPVar6->db,N,1);
      }
      pPVar6 = local_68;
      pSVar3 = (Select *)(pExpr->x).pList;
      local_80 = pExpr;
      if ((pExpr->flags & 0x800) == 0) {
        pExpr = pExpr;
        if (pSVar3 != (Select *)0x0) {
          cVar7 = sqlite3ExprAffinity(local_60);
          pPVar6 = local_68;
          pKVar5 = local_70;
          local_81 = 'A';
          if (cVar7 != '\0') {
            local_81 = cVar7;
          }
          if (local_70 != (KeyInfo *)0x0) {
            pCVar11 = sqlite3ExprCollSeq(local_68,local_80->pLeft);
            pKVar5->aColl[0] = pCVar11;
          }
          local_74 = rHasNullFlag;
          iVar9 = sqlite3GetTempReg(pPVar6);
          local_60 = (Expr *)CONCAT44(local_60._4_4_,iVar9);
          iVar9 = sqlite3GetTempReg(pPVar6);
          if (isRowid != 0) {
            sqlite3VdbeAddOp4(p_00,0x4b,0,iVar9,0,"",-1);
          }
          ppSVar16 = (SrcList **)&pSVar3->op;
          local_54 = isRowid;
          for (iVar14 = *(int *)&pSVar3->pEList; 0 < iVar14; iVar14 = iVar14 + -1) {
            p = *ppSVar16;
            if ((-1 < local_88) && (iVar10 = sqlite3ExprIsConstant((Expr *)p), iVar10 == 0)) {
              sqlite3VdbeChangeToNoop(p_00,local_88);
              local_88 = -1;
            }
            if ((isRowid == 0) || (iVar10 = sqlite3ExprIsInteger((Expr *)p,&iValToIns), iVar10 == 0)
               ) {
              iVar10 = sqlite3ExprCodeTarget(local_68,(Expr *)p,(int)local_60);
              if (isRowid != 0) {
                sqlite3VdbeAddOp2(p_00,0xf,iVar10,p_00->nOp + 2);
                p1 = local_80->iTable;
                op = 0x7a;
                goto LAB_0014f45d;
              }
              sqlite3VdbeAddOp4(p_00,0x66,iVar10,1,iVar9,&local_81,1);
              isRowid = local_54;
              sqlite3VdbeAddOp4Int(p_00,0x85,local_80->iTable,iVar9,iVar10,1);
            }
            else {
              p1 = local_80->iTable;
              op = 0x7b;
              iVar10 = iValToIns;
LAB_0014f45d:
              sqlite3VdbeAddOp3(p_00,op,p1,iVar9,iVar10);
            }
            ppSVar16 = ppSVar16 + 4;
          }
          if ((int)local_60 != 0) {
            bVar2 = local_68->nTempReg;
            if ((ulong)bVar2 < 8) {
              local_68->nTempReg = bVar2 + 1;
              local_68->aTempReg[bVar2] = (int)local_60;
            }
          }
          pExpr = local_80;
          rHasNullFlag = local_74;
          if (iVar9 != 0) {
            bVar2 = local_68->nTempReg;
            if ((ulong)bVar2 < 8) {
              local_68->nTempReg = bVar2 + 1;
              local_68->aTempReg[bVar2] = iVar9;
            }
          }
        }
      }
      else {
        pEVar4 = pSVar3->pEList;
        pcVar13 = "CORRELATED ";
        if (-1 < local_88) {
          pcVar13 = "";
        }
        local_74 = rHasNullFlag;
        sqlite3VdbeExplain(local_68,'\x01',"%sLIST SUBQUERY",pcVar13);
        pExpr = local_80;
        rHasNullFlag = local_74;
        if (pEVar4->nExpr == N) {
          local_4c = local_80->iTable;
          iValToIns = CONCAT31(iValToIns._1_3_,0xb);
          local_48._0_4_ = 0;
          local_48._4_4_ = 0;
          pcStack_40 = exprINAffinity(pPVar6,local_80);
          pSVar3->iLimit = 0;
          iVar9 = sqlite3Select(pPVar6,pSVar3,(SelectDest *)&iValToIns);
          sqlite3DbFree(pPVar6->db,pcStack_40);
          pExpr = local_80;
          if (iVar9 != 0) {
            sqlite3KeyInfoUnref(local_70);
            goto LAB_0014f664;
          }
          pEVar15 = pEVar4->a;
          uVar17 = 0;
          uVar18 = (ulong)N;
          if ((int)N < 1) {
            uVar18 = uVar17;
          }
          for (; rHasNullFlag = local_74, uVar18 != uVar17; uVar17 = uVar17 + 1) {
            pEVar12 = sqlite3VectorFieldSubexpr(local_60,(int)uVar17);
            pCVar11 = sqlite3BinaryCompareCollSeq(pPVar6,pEVar12,pEVar15->pExpr);
            local_70->aColl[uVar17] = pCVar11;
            pEVar15 = pEVar15 + 1;
          }
        }
      }
      iVar9 = 0;
      if (local_70 != (KeyInfo *)0x0) {
        sqlite3VdbeChangeP4(p_00,local_58,(char *)local_70,-9);
      }
    }
    else {
      pSVar3 = (pExpr->x).pSelect;
      pcVar13 = "CORRELATED ";
      if (-1 < local_88) {
        pcVar13 = "";
      }
      iVar9 = 1;
      sqlite3VdbeExplain(local_68,'\x01',"%sSCALAR SUBQUERY",pcVar13);
      uVar1 = pExpr->op;
      if (uVar1 == '\x7f') {
        iVar9 = pSVar3->pEList->nExpr;
      }
      local_4c = local_68->nMem + 1;
      iVar14 = local_68->nMem + iVar9;
      local_48._0_4_ = 0;
      local_48._4_4_ = 0;
      pcStack_40 = (char *)0x0;
      local_68->nMem = iVar14;
      if (uVar1 == '\x7f') {
        local_48._4_4_ = iVar9;
        local_48._0_4_ = local_4c;
        sqlite3VdbeAddOp3(p_00,0x49,0,local_4c,iVar14);
        uVar8 = 10;
      }
      else {
        sqlite3VdbeAddOp2(p_00,0x46,0,local_4c);
        uVar8 = 3;
      }
      pPVar6 = local_68;
      iValToIns = CONCAT31(iValToIns._1_3_,uVar8);
      pEVar12 = sqlite3ExprAlloc(local_68->db,0x8f,sqlite3IntTokens + 1,0);
      if (pSVar3->pLimit == (Expr *)0x0) {
        pEVar12 = sqlite3PExpr(pPVar6,0x89,pEVar12,(Expr *)0x0);
        pSVar3->pLimit = pEVar12;
      }
      else {
        sqlite3ExprDelete(pPVar6->db,pSVar3->pLimit->pLeft);
        pSVar3->pLimit->pLeft = pEVar12;
      }
      pSVar3->iLimit = 0;
      iVar14 = sqlite3Select(pPVar6,pSVar3,(SelectDest *)&iValToIns);
      iVar9 = local_4c;
      if (iVar14 != 0) goto LAB_0014f664;
    }
    if (rHasNullFlag != 0) {
      sqlite3SetHasNullFlag(p_00,pExpr->iTable,rHasNullFlag);
    }
    if (-1 < local_88) {
      sqlite3VdbeJumpHere(p_00,local_88);
    }
  }
  return iVar9;
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN, SELECT, or EXISTS operator */
  int rHasNullFlag,       /* Register that records whether NULLs exist in RHS */
  int isRowid             /* If true, LHS of IN operator is a rowid */
){
  int jmpIfDynamic = -1;                      /* One-time test address */
  int rReg = 0;                           /* Register storing resulting */
  Vdbe *v = sqlite3GetVdbe(pParse);
  if( NEVER(v==0) ) return 0;

  /* The evaluation of the IN/EXISTS/SELECT must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) ){
    jmpIfDynamic = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

  switch( pExpr->op ){
    case TK_IN: {
      int addr;                   /* Address of OP_OpenEphemeral instruction */
      Expr *pLeft = pExpr->pLeft; /* the LHS of the IN operator */
      KeyInfo *pKeyInfo = 0;      /* Key information */
      int nVal;                   /* Size of vector pLeft */
      
      nVal = sqlite3ExprVectorSize(pLeft);
      assert( !isRowid || nVal==1 );

      /* Whether this is an 'x IN(SELECT...)' or an 'x IN(<exprlist>)'
      ** expression it is handled the same way.  An ephemeral table is 
      ** filled with index keys representing the results from the 
      ** SELECT or the <exprlist>.
      **
      ** If the 'x' expression is a column value, or the SELECT...
      ** statement returns a column value, then the affinity of that
      ** column is used to build the index keys. If both 'x' and the
      ** SELECT... statement are columns, then numeric affinity is used
      ** if either column has NUMERIC or INTEGER affinity. If neither
      ** 'x' nor the SELECT... statement are columns, then numeric affinity
      ** is used.
      */
      pExpr->iTable = pParse->nTab++;
      addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, 
          pExpr->iTable, (isRowid?0:nVal));
      pKeyInfo = isRowid ? 0 : sqlite3KeyInfoAlloc(pParse->db, nVal, 1);

      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* Case 1:     expr IN (SELECT ...)
        **
        ** Generate code to write the results of the select into the temporary
        ** table allocated and opened above.
        */
        Select *pSelect = pExpr->x.pSelect;
        ExprList *pEList = pSelect->pEList;

        ExplainQueryPlan((pParse, 1, "%sLIST SUBQUERY",
            jmpIfDynamic>=0?"":"CORRELATED "
        ));
        assert( !isRowid );
        /* If the LHS and RHS of the IN operator do not match, that
        ** error will have been caught long before we reach this point. */
        if( ALWAYS(pEList->nExpr==nVal) ){
          SelectDest dest;
          int i;
          sqlite3SelectDestInit(&dest, SRT_Set, pExpr->iTable);
          dest.zAffSdst = exprINAffinity(pParse, pExpr);
          pSelect->iLimit = 0;
          testcase( pSelect->selFlags & SF_Distinct );
          testcase( pKeyInfo==0 ); /* Caused by OOM in sqlite3KeyInfoAlloc() */
          if( sqlite3Select(pParse, pSelect, &dest) ){
            sqlite3DbFree(pParse->db, dest.zAffSdst);
            sqlite3KeyInfoUnref(pKeyInfo);
            return 0;
          }
          sqlite3DbFree(pParse->db, dest.zAffSdst);
          assert( pKeyInfo!=0 ); /* OOM will cause exit after sqlite3Select() */
          assert( pEList!=0 );
          assert( pEList->nExpr>0 );
          assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
          for(i=0; i<nVal; i++){
            Expr *p = sqlite3VectorFieldSubexpr(pLeft, i);
            pKeyInfo->aColl[i] = sqlite3BinaryCompareCollSeq(
                pParse, p, pEList->a[i].pExpr
            );
          }
        }
      }else if( ALWAYS(pExpr->x.pList!=0) ){
        /* Case 2:     expr IN (exprlist)
        **
        ** For each expression, build an index key from the evaluation and
        ** store it in the temporary table. If <expr> is a column, then use
        ** that columns affinity when building index keys. If <expr> is not
        ** a column, use numeric affinity.
        */
        char affinity;            /* Affinity of the LHS of the IN */
        int i;
        ExprList *pList = pExpr->x.pList;
        struct ExprList_item *pItem;
        int r1, r2, r3;
        affinity = sqlite3ExprAffinity(pLeft);
        if( !affinity ){
          affinity = SQLITE_AFF_BLOB;
        }
        if( pKeyInfo ){
          assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
          pKeyInfo->aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
        }

        /* Loop through each expression in <exprlist>. */
        r1 = sqlite3GetTempReg(pParse);
        r2 = sqlite3GetTempReg(pParse);
        if( isRowid ) sqlite3VdbeAddOp4(v, OP_Blob, 0, r2, 0, "", P4_STATIC);
        for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
          Expr *pE2 = pItem->pExpr;
          int iValToIns;

          /* If the expression is not constant then we will need to
          ** disable the test that was generated above that makes sure
          ** this code only executes once.  Because for a non-constant
          ** expression we need to rerun this code each time.
          */
          if( jmpIfDynamic>=0 && !sqlite3ExprIsConstant(pE2) ){
            sqlite3VdbeChangeToNoop(v, jmpIfDynamic);
            jmpIfDynamic = -1;
          }

          /* Evaluate the expression and insert it into the temp table */
          if( isRowid && sqlite3ExprIsInteger(pE2, &iValToIns) ){
            sqlite3VdbeAddOp3(v, OP_InsertInt, pExpr->iTable, r2, iValToIns);
          }else{
            r3 = sqlite3ExprCodeTarget(pParse, pE2, r1);
            if( isRowid ){
              sqlite3VdbeAddOp2(v, OP_MustBeInt, r3,
                                sqlite3VdbeCurrentAddr(v)+2);
              VdbeCoverage(v);
              sqlite3VdbeAddOp3(v, OP_Insert, pExpr->iTable, r2, r3);
            }else{
              sqlite3VdbeAddOp4(v, OP_MakeRecord, r3, 1, r2, &affinity, 1);
              sqlite3VdbeAddOp4Int(v, OP_IdxInsert, pExpr->iTable, r2, r3, 1);
            }
          }
        }
        sqlite3ReleaseTempReg(pParse, r1);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      if( pKeyInfo ){
        sqlite3VdbeChangeP4(v, addr, (void *)pKeyInfo, P4_KEYINFO);
      }
      break;
    }

    case TK_EXISTS:
    case TK_SELECT:
    default: {
      /* Case 3:    (SELECT ... FROM ...)
      **     or:    EXISTS(SELECT ... FROM ...)
      **
      ** For a SELECT, generate code to put the values for all columns of
      ** the first row into an array of registers and return the index of
      ** the first register.
      **
      ** If this is an EXISTS, write an integer 0 (not exists) or 1 (exists)
      ** into a register and return that register number.
      **
      ** In both cases, the query is augmented with "LIMIT 1".  Any 
      ** preexisting limit is discarded in place of the new LIMIT 1.
      */
      Select *pSel;                         /* SELECT statement to encode */
      SelectDest dest;                      /* How to deal with SELECT result */
      int nReg;                             /* Registers to allocate */
      Expr *pLimit;                         /* New limit expression */

      testcase( pExpr->op==TK_EXISTS );
      testcase( pExpr->op==TK_SELECT );
      assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );
      assert( ExprHasProperty(pExpr, EP_xIsSelect) );

      pSel = pExpr->x.pSelect;
      ExplainQueryPlan((pParse, 1, "%sSCALAR SUBQUERY",
            jmpIfDynamic>=0?"":"CORRELATED "));
      nReg = pExpr->op==TK_SELECT ? pSel->pEList->nExpr : 1;
      sqlite3SelectDestInit(&dest, 0, pParse->nMem+1);
      pParse->nMem += nReg;
      if( pExpr->op==TK_SELECT ){
        dest.eDest = SRT_Mem;
        dest.iSdst = dest.iSDParm;
        dest.nSdst = nReg;
        sqlite3VdbeAddOp3(v, OP_Null, 0, dest.iSDParm, dest.iSDParm+nReg-1);
        VdbeComment((v, "Init subquery result"));
      }else{
        dest.eDest = SRT_Exists;
        sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
        VdbeComment((v, "Init EXISTS result"));
      }
      pLimit = sqlite3ExprAlloc(pParse->db, TK_INTEGER,&sqlite3IntTokens[1], 0);
      if( pSel->pLimit ){
        sqlite3ExprDelete(pParse->db, pSel->pLimit->pLeft);
        pSel->pLimit->pLeft = pLimit;
      }else{
        pSel->pLimit = sqlite3PExpr(pParse, TK_LIMIT, pLimit, 0);
      }
      pSel->iLimit = 0;
      if( sqlite3Select(pParse, pSel, &dest) ){
        return 0;
      }
      rReg = dest.iSDParm;
      ExprSetVVAProperty(pExpr, EP_NoReduce);
      break;
    }
  }

  if( rHasNullFlag ){
    sqlite3SetHasNullFlag(v, pExpr->iTable, rHasNullFlag);
  }

  if( jmpIfDynamic>=0 ){
    sqlite3VdbeJumpHere(v, jmpIfDynamic);
  }

  return rReg;
}